

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

char * init_data_segement(void)

{
  char *__s;
  undefined4 *puVar1;
  char *ptr;
  
  __s = (char *)malloc(0xffff);
  if (__s != (char *)0x0) {
    memset(__s,0,0xffff);
    return __s;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0xf2;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

char* init_data_segement() {
	char *ptr{ nullptr };
	ptr = (char *)malloc(data_length);
	if (ptr != nullptr) {
		memset(ptr, 0, data_length);//内存清空
		return ptr;
	}
	else throw(LVM_DATA_SEGEMENT_ERROR);
}